

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.cc
# Opt level: O0

void __thiscall dtc::text_input_buffer::parse_error(text_input_buffer *this,char *msg)

{
  bool bVar1;
  __shared_ptr_access<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *b_00;
  input_buffer *b;
  char *msg_local;
  text_input_buffer *this_local;
  
  bVar1 = std::
          stack<std::shared_ptr<dtc::input_buffer>,_std::deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>_>
          ::empty(&this->input_stack);
  if (bVar1) {
    fprintf(_stderr,"Error: %s\n",msg);
  }
  else {
    this_00 = (__shared_ptr_access<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              std::
              stack<std::shared_ptr<dtc::input_buffer>,_std::deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>_>
              ::top(&this->input_stack);
    b_00 = std::__shared_ptr_access<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*(this_00);
    parse_error(this,msg,b_00,b_00->cursor);
  }
  return;
}

Assistant:

void
text_input_buffer::parse_error(const char *msg)
{
	if (input_stack.empty())
	{
		fprintf(stderr, "Error: %s\n", msg);
		return;
	}
	input_buffer &b = *input_stack.top();
	parse_error(msg, b, b.cursor);
}